

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_>::
operator=(ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *this
         ,ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *r)

{
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> local_20;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> temp;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *r_local;
  ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *this_local;
  
  temp.ptr = (internal_node<immutable::vector<char,_false,_6>,_true> *)r;
  ref(&local_20,r);
  swap(this,&local_20);
  ~ref(&local_20);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }